

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

void __thiscall
BuildStatus::BuildEdgeFinished
          (BuildStatus *this,Edge *edge,bool success,string *output,int *start_time,int *end_time)

{
  LinePrinter *this_00;
  bool bVar1;
  int64_t iVar2;
  iterator __position;
  undefined7 in_register_00000011;
  pointer ppNVar3;
  Edge *edge_local;
  string *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined4 local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string outputs;
  
  local_74 = (undefined4)CONCAT71(in_register_00000011,success);
  edge_local = edge;
  local_a0 = output;
  iVar2 = GetTimeMillis();
  this->finished_edges_ = this->finished_edges_ + 1;
  __position = std::
               _Rb_tree<const_Edge_*,_std::pair<const_Edge_*const,_int>,_std::_Select1st<std::pair<const_Edge_*const,_int>_>,_std::less<const_Edge_*>,_std::allocator<std::pair<const_Edge_*const,_int>_>_>
               ::find(&(this->running_edges_)._M_t,&edge_local);
  *start_time = *(int *)&__position._M_node[1]._M_parent;
  *end_time = (int)iVar2 - (int)this->start_time_millis_;
  std::
  _Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
  ::erase_abi_cxx11_((_Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
                      *)&this->running_edges_,__position);
  bVar1 = Edge::use_console(edge_local);
  if (bVar1) {
    LinePrinter::SetConsoleLocked(&this->printer_,false);
  }
  if (*(int *)this->config_ != 1) {
    bVar1 = Edge::use_console(edge_local);
    if (!bVar1) {
      PrintStatus(this,edge_local,kEdgeFinished);
    }
    if ((char)local_74 == '\0') {
      outputs._M_dataplus._M_p = (pointer)&outputs.field_2;
      outputs._M_string_length = 0;
      outputs.field_2._M_local_buf[0] = '\0';
      for (ppNVar3 = (edge_local->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppNVar3 !=
          (edge_local->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppNVar3 = ppNVar3 + 1) {
        std::operator+(&local_98,&(*ppNVar3)->path_," ");
        std::__cxx11::string::append((string *)&outputs);
        std::__cxx11::string::~string((string *)&local_98);
      }
      this_00 = &this->printer_;
      if ((this->printer_).supports_color_ == false) {
        std::operator+(&local_70,"FAILED: ",&outputs);
        std::operator+(&local_98,&local_70,"\n");
        LinePrinter::PrintOnNewLine(this_00,&local_98);
      }
      else {
        std::operator+(&local_70,"\x1b[31mFAILED: \x1b[0m",&outputs);
        std::operator+(&local_98,&local_70,"\n");
        LinePrinter::PrintOnNewLine(this_00,&local_98);
      }
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_70);
      Edge::EvaluateCommand_abi_cxx11_(&local_70,edge_local,false);
      std::operator+(&local_98,&local_70,"\n");
      LinePrinter::PrintOnNewLine(this_00,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&outputs);
    }
    if (local_a0->_M_string_length != 0) {
      outputs._M_dataplus._M_p = (pointer)&outputs.field_2;
      outputs._M_string_length = 0;
      outputs.field_2._M_local_buf[0] = '\0';
      if ((this->printer_).supports_color_ == false) {
        StripAnsiEscapeCodes(&local_98,local_a0);
        std::__cxx11::string::operator=((string *)&outputs,(string *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&outputs);
      }
      LinePrinter::PrintOnNewLine(&this->printer_,&outputs);
      std::__cxx11::string::~string((string *)&outputs);
    }
  }
  return;
}

Assistant:

void BuildStatus::BuildEdgeFinished(Edge* edge,
                                    bool success,
                                    const string& output,
                                    int* start_time,
                                    int* end_time) {
  int64_t now = GetTimeMillis();

  ++finished_edges_;

  RunningEdgeMap::iterator i = running_edges_.find(edge);
  *start_time = i->second;
  *end_time = (int)(now - start_time_millis_);
  running_edges_.erase(i);

  if (edge->use_console())
    printer_.SetConsoleLocked(false);

  if (config_.verbosity == BuildConfig::QUIET)
    return;

  if (!edge->use_console())
    PrintStatus(edge, kEdgeFinished);

  // Print the command that is spewing before printing its output.
  if (!success) {
    string outputs;
    for (vector<Node*>::const_iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o)
      outputs += (*o)->path() + " ";

    if (printer_.supports_color()) {
        printer_.PrintOnNewLine("\x1B[31m" "FAILED: " "\x1B[0m" + outputs + "\n");
    } else {
        printer_.PrintOnNewLine("FAILED: " + outputs + "\n");
    }
    printer_.PrintOnNewLine(edge->EvaluateCommand() + "\n");
  }

  if (!output.empty()) {
    // ninja sets stdout and stderr of subprocesses to a pipe, to be able to
    // check if the output is empty. Some compilers, e.g. clang, check
    // isatty(stderr) to decide if they should print colored output.
    // To make it possible to use colored output with ninja, subprocesses should
    // be run with a flag that forces them to always print color escape codes.
    // To make sure these escape codes don't show up in a file if ninja's output
    // is piped to a file, ninja strips ansi escape codes again if it's not
    // writing to a |smart_terminal_|.
    // (Launching subprocesses in pseudo ttys doesn't work because there are
    // only a few hundred available on some systems, and ninja can launch
    // thousands of parallel compile commands.)
    string final_output;
    if (!printer_.supports_color())
      final_output = StripAnsiEscapeCodes(output);
    else
      final_output = output;

#ifdef _WIN32
    // Fix extra CR being added on Windows, writing out CR CR LF (#773)
    _setmode(_fileno(stdout), _O_BINARY);  // Begin Windows extra CR fix
#endif

    printer_.PrintOnNewLine(final_output);

#ifdef _WIN32
    _setmode(_fileno(stdout), _O_TEXT);  // End Windows extra CR fix
#endif
  }
}